

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void OpenBreakpointsFile(path *filename,EBreakpointsFile type)

{
  char cVar1;
  string local_38;
  
  cVar1 = std::filesystem::__cxx11::path::has_filename();
  if (cVar1 == '\0') {
    std::filesystem::__cxx11::path::string(&local_38,filename);
    Error("empty filename",local_38._M_dataplus._M_p,EARLY);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    if (FP_BreakpointsFile != (FILE *)0x0) {
      Error("breakpoints file was already opened",(char *)0x0,EARLY);
      return;
    }
    FP_BreakpointsFile = SJ_fopen(filename,"w");
    if (FP_BreakpointsFile == (FILE *)0x0) {
      std::filesystem::__cxx11::path::string(&local_38,filename);
      Error("opening file for write",local_38._M_dataplus._M_p,EARLY);
      std::__cxx11::string::~string((string *)&local_38);
    }
    breakpointsCounter = 0;
    breakpointsType = type;
  }
  return;
}

Assistant:

void OpenBreakpointsFile(const std::filesystem::path & filename, const EBreakpointsFile type) {
	if (!filename.has_filename()) {
		Error("empty filename", filename.string().c_str(), EARLY);
		return;
	}
	if (FP_BreakpointsFile) {
		Error("breakpoints file was already opened", nullptr, EARLY);
		return;
	}
	if (!FOPEN_ISOK(FP_BreakpointsFile, filename, "w")) {
		Error("opening file for write", filename.string().c_str(), EARLY);
	}
	breakpointsCounter = 0;
	breakpointsType = type;
}